

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O3

void helicsTranslatorSetOption(HelicsTranslator trans,int option,int value,HelicsError *err)

{
  TranslatorObject *pTVar1;
  
  pTVar1 = getTranslatorObj(trans,err);
  if (pTVar1 != (TranslatorObject *)0x0) {
    (*(pTVar1->transPtr->super_Interface)._vptr_Interface[2])
              (pTVar1->transPtr,(ulong)(uint)option,(ulong)(uint)value);
  }
  return;
}

Assistant:

void helicsTranslatorSetOption(HelicsTranslator trans, int option, int value, HelicsError* err)
{
    auto* transObj = getTranslatorObj(trans, err);
    if (transObj == nullptr) {
        return;
    }
    try {
        transObj->transPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}